

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

float * drmp3__full_read_and_close_f32
                  (drmp3 *pMP3,drmp3_config *pConfig,drmp3_uint64 *pTotalFrameCount)

{
  ulong framesToRead;
  drmp3_uint32 dVar1;
  float *__ptr;
  drmp3_uint64 dVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  float temp [4096];
  ulong local_4058;
  float local_4038 [4098];
  
  local_4058 = 0;
  __ptr = (float *)0x0;
  uVar5 = 0;
  do {
    framesToRead = 0x1000 / (ulong)pMP3->channels;
    dVar2 = drmp3_read_pcm_frames_f32(pMP3,framesToRead,local_4038);
    uVar4 = uVar5;
    pfVar3 = __ptr;
    if (dVar2 == 0) break;
    uVar4 = dVar2 + uVar5;
    if (local_4058 < uVar4) {
      local_4058 = local_4058 * 2;
      if (local_4058 <= uVar4) {
        local_4058 = uVar4;
      }
      pfVar3 = (float *)realloc(__ptr,pMP3->channels * local_4058 * 4);
      if (pfVar3 == (float *)0x0) {
        free(__ptr);
        uVar4 = uVar5;
        pfVar3 = __ptr;
        break;
      }
    }
    memcpy(pfVar3 + uVar5 * pMP3->channels,local_4038,pMP3->channels * dVar2 * 4);
    __ptr = pfVar3;
    uVar5 = uVar4;
  } while (dVar2 == framesToRead);
  if (pConfig != (drmp3_config *)0x0) {
    dVar1 = pMP3->sampleRate;
    pConfig->outputChannels = pMP3->channels;
    pConfig->outputSampleRate = dVar1;
  }
  drmp3_uninit(pMP3);
  if (pTotalFrameCount != (drmp3_uint64 *)0x0) {
    *pTotalFrameCount = uVar4;
  }
  return pfVar3;
}

Assistant:

float* drmp3__full_read_and_close_f32(drmp3* pMP3, drmp3_config* pConfig, drmp3_uint64* pTotalFrameCount)
{
            drmp3_assert(pMP3 != NULL);

    drmp3_uint64 totalFramesRead = 0;
    drmp3_uint64 framesCapacity = 0;
    float* pFrames = NULL;

    float temp[4096];
    for (;;) {
        drmp3_uint64 framesToReadRightNow = drmp3_countof(temp) / pMP3->channels;
        drmp3_uint64 framesJustRead = drmp3_read_pcm_frames_f32(pMP3, framesToReadRightNow, temp);
        if (framesJustRead == 0) {
            break;
        }

        // Reallocate the output buffer if there's not enough room.
        if (framesCapacity < totalFramesRead + framesJustRead) {
            framesCapacity *= 2;
            if (framesCapacity < totalFramesRead + framesJustRead) {
                framesCapacity = totalFramesRead + framesJustRead;
            }

            drmp3_uint64 newFramesBufferSize = framesCapacity*pMP3->channels*sizeof(float);
            if (newFramesBufferSize > DRMP3_SIZE_MAX) {
                break;
            }

            float* pNewFrames = (float*)drmp3_realloc(pFrames, (size_t)newFramesBufferSize);
            if (pNewFrames == NULL) {
                drmp3_free(pFrames);
                break;
            }

            pFrames = pNewFrames;
        }

        drmp3_copy_memory(pFrames + totalFramesRead*pMP3->channels, temp, (size_t)(framesJustRead*pMP3->channels*sizeof(float)));
        totalFramesRead += framesJustRead;

        // If the number of frames we asked for is less that what we actually read it means we've reached the end.
        if (framesJustRead != framesToReadRightNow) {
            break;
        }
    }

    if (pConfig != NULL) {
        pConfig->outputChannels = pMP3->channels;
        pConfig->outputSampleRate = pMP3->sampleRate;
    }

    drmp3_uninit(pMP3);

    if (pTotalFrameCount) *pTotalFrameCount = totalFramesRead;
    return pFrames;
}